

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_varbuff_to_bytes
              (uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  size_t sVar2;
  long lStack_10;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if (bytes_out != (uchar *)0x0 && (bytes_len == 0) != (bytes != (uchar *)0x0)) {
    if (bytes_len < 0xfd) {
      lStack_10 = 1;
    }
    else if (bytes_len < 0x10000) {
      lStack_10 = 3;
    }
    else {
      lStack_10 = (ulong)(bytes_len >> 0x20 != 0) * 4 + 5;
    }
    if ((written != (size_t *)0x0) && (lStack_10 + bytes_len <= len)) {
      sVar2 = varbuff_to_bytes(bytes,bytes_len,bytes_out);
      *written = sVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_varbuff_to_bytes(const unsigned char *bytes, size_t bytes_len,
                           unsigned char *bytes_out, size_t len, size_t *written)
{
    if (written)
        *written = 0;
    if (BYTES_INVALID(bytes, bytes_len) || !bytes_out ||
        len < varint_get_length(bytes_len) + bytes_len || !written)
        return WALLY_EINVAL;
    *written = varbuff_to_bytes(bytes, bytes_len, bytes_out);
    return WALLY_OK;
}